

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall ON_wString::RichTextExample(ON_wString *this,ON_Font *font)

{
  bool bVar1;
  bool bItalic;
  bool bBoldItalic;
  ON_FontFaceQuartet *this_00;
  undefined1 auStack_58 [16];
  ON_FontFaceQuartet q;
  
  this_00 = (ON_FontFaceQuartet *)auStack_58;
  if (font == (ON_Font *)0x0) {
    font = &ON_Font::Default;
  }
  ON_Font::FontQuartet(&q,font);
  bVar1 = ON_FontFaceQuartet::IsNotEmpty(&q);
  if (bVar1) {
    this_00 = (ON_FontFaceQuartet *)(auStack_58 + 8);
    ON_FontFaceQuartet::QuartetName(this_00);
    bVar1 = ON_FontFaceQuartet::HasBoldFace(&q);
    bItalic = ON_FontFaceQuartet::HasItalicFace(&q);
    bBoldItalic = ON_FontFaceQuartet::HasBoldItalicFace(&q);
    RichTextExample(this,(ON_wString *)this_00,bVar1,bItalic,bBoldItalic,true);
  }
  else {
    ON_Font::RichTextFontName((ON_Font *)auStack_58);
    RichTextExample(this,(ON_wString *)auStack_58,true,true,true,true);
  }
  ~ON_wString(&this_00->m_quartet_name);
  ~ON_wString(&q.m_quartet_name);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RichTextExample(
  const ON_Font* font
)
{
  if (nullptr == font)
    font = &ON_Font::Default;
  const ON_FontFaceQuartet q = font->FontQuartet();
  if (q.IsNotEmpty())
  {
    // restrict example to supported faces
    // Many fonts (Arial Black, Corsiva, ...) do not have all 4 rich text faces.
    return ON_wString::RichTextExample(q.QuartetName(), q.HasBoldFace(), q.HasItalicFace(), q.HasBoldItalicFace(), true);
  }

  return ON_wString::RichTextExample(font->RichTextFontName(), true, true, true, true);
}